

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O3

void __thiscall pg::MSPMSolver::MSPMSolver(MSPMSolver *this,Oink *oink,Game *game)

{
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__MSPMSolver_001b1990;
  this->iterations = 0;
  this->lift_attempt = 0;
  this->lift_count = 0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = (_Elt_pointer)0x0;
  (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            (&(this->todo).super__Deque_base<int,_std::allocator<int>_>,0);
  (this->looping).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->looping).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->looping).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  return;
}

Assistant:

MSPMSolver::MSPMSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}